

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O2

int Sim_NtkSimTwoPats_rec(Abc_Obj_t *pNode)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    uVar2 = Sim_NtkSimTwoPats_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray])
    ;
    uVar3 = Sim_NtkSimTwoPats_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]);
    uVar2 = ((*(int *)&pNode->field_0x14 << 0x14) >> 0x1f ^ uVar3) &
            ((*(int *)&pNode->field_0x14 << 0x15) >> 0x1f ^ uVar2);
    pNode->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)(int)uVar2;
  }
  else {
    uVar2 = (pNode->field_6).iTemp;
  }
  return uVar2;
}

Assistant:

int Sim_NtkSimTwoPats_rec( Abc_Obj_t * pNode )
{
    int Value0, Value1;
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return (int)(ABC_PTRUINT_T)pNode->pCopy;
    Abc_NodeSetTravIdCurrent( pNode );
    Value0 = Sim_NtkSimTwoPats_rec( Abc_ObjFanin0(pNode) );
    Value1 = Sim_NtkSimTwoPats_rec( Abc_ObjFanin1(pNode) );
    if ( Abc_ObjFaninC0(pNode) )
        Value0 = ~Value0;
    if ( Abc_ObjFaninC1(pNode) )
        Value1 = ~Value1;
    pNode->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)(Value0 & Value1);
    return Value0 & Value1;
}